

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaSN.cpp
# Opt level: O0

double ** __thiscall
OmegaSN::preprocessing(OmegaSN *this,vector<double,_std::allocator<double>_> *data)

{
  double dVar1;
  double dVar2;
  size_type sVar3;
  reference pvVar4;
  int iVar5;
  uint local_28;
  uint local_24;
  uint i_2;
  uint i_1;
  uint i;
  uint n;
  vector<double,_std::allocator<double>_> *data_local;
  OmegaSN *this_local;
  
  sVar3 = std::vector<double,_std::allocator<double>_>::size(data);
  iVar5 = (int)sVar3;
  **this->S12P = 0.0;
  *this->S12P[1] = 0.0;
  *this->S12P[2] = 0.0;
  for (i_2 = 1; i_2 < iVar5 + 1U; i_2 = i_2 + 1) {
    dVar1 = (*this->S12P)[i_2 - 1];
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](data,(ulong)(i_2 - 1));
    (*this->S12P)[i_2] = dVar1 + *pvVar4;
  }
  for (local_24 = 1; local_24 < iVar5 + 1U; local_24 = local_24 + 1) {
    dVar1 = this->S12P[1][local_24 - 1];
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](data,(ulong)(local_24 - 1));
    dVar2 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](data,(ulong)(local_24 - 1));
    this->S12P[1][local_24] = dVar2 * *pvVar4 + dVar1;
  }
  for (local_28 = 1; local_28 < iVar5 + 1U; local_28 = local_28 + 1) {
    dVar1 = this->S12P[2][local_28 - 1];
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](data,(ulong)(local_28 - 1));
    this->S12P[2][local_28] = (double)local_28 * *pvVar4 + dVar1;
  }
  return this->S12P;
}

Assistant:

double** OmegaSN::preprocessing(std::vector< double >& data) const
{
  unsigned int n = data.size();
  S12P[0][0] = 0;
  S12P[1][0] = 0;
  S12P[2][0] = 0;
  for(unsigned int i = 1; i < (n + 1); i++){S12P[0][i] = S12P[0][i-1] + data[i-1];}
  for(unsigned int i = 1; i < (n + 1); i++){S12P[1][i] = S12P[1][i-1] + (data[i-1] * data[i-1]);}
  for(unsigned int i = 1; i < (n + 1); i++){S12P[2][i] = S12P[2][i-1] + i * data[i-1];}
  return(S12P);
}